

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O1

void pair1_send_sched(pair1_sock *s)

{
  nni_mtx *mtx;
  nni_lmq *lmq;
  pair1_pipe *p;
  _Bool _Var1;
  int iVar2;
  nni_msg *in_RAX;
  nni_aio *aio;
  size_t count;
  nni_msg *local_38;
  nni_msg *m;
  
  mtx = &s->mtx;
  local_38 = in_RAX;
  nni_mtx_lock(mtx);
  p = s->p;
  if (p == (pair1_pipe *)0x0) {
    nni_mtx_unlock(mtx);
    return;
  }
  s->wr_ready = true;
  lmq = &s->wmq;
  iVar2 = nni_lmq_get(lmq,&local_38);
  if (iVar2 == 0) {
    pair1_pipe_send(p,local_38);
    aio = (nni_aio *)nni_list_first(&s->waq);
    if (aio != (nni_aio *)0x0) {
      nni_aio_list_remove(aio);
      local_38 = nni_aio_get_msg(aio);
      count = nni_msg_len(local_38);
      nni_lmq_put(lmq,local_38);
      goto LAB_0011b6c0;
    }
  }
  else {
    aio = (nni_aio *)nni_list_first(&s->waq);
    if (aio != (nni_aio *)0x0) {
      nni_aio_list_remove(aio);
      local_38 = nni_aio_get_msg(aio);
      count = nni_msg_len(local_38);
      pair1_pipe_send(p,local_38);
      goto LAB_0011b6c0;
    }
  }
  aio = (nni_aio *)0x0;
  count = 0;
LAB_0011b6c0:
  _Var1 = nni_lmq_full(lmq);
  if ((!_Var1) || (s->wr_ready == true)) {
    nni_pollable_raise(&s->writable);
  }
  nni_mtx_unlock(mtx);
  if (aio != (nni_aio *)0x0) {
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_aio_finish_sync(aio,NNG_OK,count);
  }
  return;
}

Assistant:

static void
pair1_send_sched(pair1_sock *s)
{
	pair1_pipe *p;
	nni_msg    *m;
	nni_aio    *a = NULL;
	size_t      l = 0;

	nni_mtx_lock(&s->mtx);

	if ((p = s->p) == NULL) {
		nni_mtx_unlock(&s->mtx);
		return;
	}

	s->wr_ready = true;

	// if message waiting in buffered queue, then we prefer that.
	if (nni_lmq_get(&s->wmq, &m) == 0) {
		pair1_pipe_send(p, m);

		if ((a = nni_list_first(&s->waq)) != NULL) {
			nni_aio_list_remove(a);
			m = nni_aio_get_msg(a);
			l = nni_msg_len(m);
			nni_lmq_put(&s->wmq, m);
		}

	} else if ((a = nni_list_first(&s->waq)) != NULL) {
		// Looks like we had the unbuffered case, but
		// someone was waiting.
		nni_aio_list_remove(a);

		m = nni_aio_get_msg(a);
		l = nni_msg_len(m);
		pair1_pipe_send(p, m);
	}

	// if we were blocked before, but not now, update.
	if ((!nni_lmq_full(&s->wmq)) || s->wr_ready) {
		nni_pollable_raise(&s->writable);
	}

	nni_mtx_unlock(&s->mtx);

	if (a != NULL) {
		nni_aio_set_msg(a, NULL);
		nni_aio_finish_sync(a, 0, l);
	}
}